

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

string * __thiscall
NDevice::getPrintStr_abi_cxx11_(string *__return_storage_ptr__,NDevice *this,int indent)

{
  pointer pNVar1;
  string *psVar2;
  ostream *poVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  string indentStr;
  ostringstream oss;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  string local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"    ","");
  if (0 < indent) {
    iVar5 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Printing \'NDevice\'\n",0x13);
  if (0 < indent) {
    iVar5 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    -name       : ",0x12)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (0 < indent) {
    iVar5 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    -numBytes   : ",0x12)
  ;
  poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->numBytes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (0 < indent) {
    iVar5 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    -byteOffset : ",0x12)
  ;
  poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->byteOffset);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (0 < indent) {
    iVar5 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -Channels vector size[",0x1a);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]:\n",3);
  local_1b0 = __return_storage_ptr__;
  if (0 < (int)((ulong)((long)(this->channels).
                              super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->channels).
                             super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 6)) {
    uVar6 = 0;
    do {
      iVar5 = indent;
      if (0 < indent) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        - i[",0xc);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)uVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] : \n",5);
      pNVar1 = (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->channels).
                        super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pNVar1 >> 6) <= uVar6) {
        uVar4 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar6);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar4);
      }
      NDeviceChannel::getPrintStr_abi_cxx11_(&local_1d0,pNVar1 + uVar6,indent + 2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 <
             (long)(int)((ulong)((long)(this->channels).
                                       super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->channels).
                                      super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  psVar2 = local_1b0;
  std::__cxx11::stringbuf::str();
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string NDevice::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "    ";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "Printing 'NDevice'\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -name       : " << name << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -numBytes   : " << numBytes << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -byteOffset : " << byteOffset << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -Channels vector size[" << channels.size() << "]:\n";
    for (int i = 0; i < (int)channels.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : \n" << channels.at(i).getPrintStr(indent+2) << "\n";
    }
    return(oss.str());
}